

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O2

void __thiscall IContactList::AddContact(IContactList *this,char *pName,char *pClan)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  if ((this->m_NumContacts != 0x80) && ((*pName != '\0' || (*pClan != '\0')))) {
    uVar3 = str_quickhash(pName);
    uVar4 = str_quickhash(pClan);
    uVar1 = this->m_NumContacts;
    lVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 * 0x7c - lVar5 != 0; lVar5 = lVar5 + 0x7c) {
      if ((*(uint *)(this->m_aContacts[0].m_aClan + lVar5 + 0x33) == uVar3) &&
         (*(uint *)(this->m_aContacts[0].m_aClan + lVar5 + 0x37) == uVar4)) {
        return;
      }
    }
    str_utf8_copy_num(this->m_aContacts[(int)uVar1].m_aName,pName,0x41,0x10);
    str_utf8_copy_num(this->m_aContacts[this->m_NumContacts].m_aClan,pClan,0x31,0xc);
    iVar2 = this->m_NumContacts;
    this->m_aContacts[iVar2].m_NameHash = uVar3;
    this->m_aContacts[iVar2].m_ClanHash = uVar4;
    this->m_NumContacts = iVar2 + 1;
  }
  return;
}

Assistant:

void IContactList::AddContact(const char *pName, const char *pClan)
{
	if(m_NumContacts == CContactInfo::MAX_CONTACTS || (pName[0] == 0 && pClan[0] == 0))
		return;

	// make sure we don't have the friend already
	unsigned NameHash = str_quickhash(pName);
	unsigned ClanHash = str_quickhash(pClan);
	for(int i = 0; i < m_NumContacts; ++i)
	{
		if(m_aContacts[i].m_NameHash == NameHash && m_aContacts[i].m_ClanHash == ClanHash)
			return;
	}

	str_utf8_copy_num(m_aContacts[m_NumContacts].m_aName, pName, sizeof(m_aContacts[m_NumContacts].m_aName), MAX_NAME_LENGTH);
	str_utf8_copy_num(m_aContacts[m_NumContacts].m_aClan, pClan, sizeof(m_aContacts[m_NumContacts].m_aClan), MAX_CLAN_LENGTH);
	m_aContacts[m_NumContacts].m_NameHash = NameHash;
	m_aContacts[m_NumContacts].m_ClanHash = ClanHash;
	++m_NumContacts;
}